

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Array2D<float> * __thiscall
pbrt::Sample2DFunction
          (Array2D<float> *__return_storage_ptr__,pbrt *this,function<float_(float,_float)> *f,
          int nu,int nv,int nSamples,Bounds2f domain,Allocator alloc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  pointer pPVar7;
  ulong uVar8;
  pointer pPVar9;
  int nx;
  undefined4 in_register_0000008c;
  allocator_type allocator;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined8 in_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  float fVar20;
  undefined8 in_XMM1_Qb;
  undefined1 auVar21 [16];
  undefined4 in_XMM7_Da;
  undefined1 in_register_000013c4 [12];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  Tuple2<pbrt::Point2,_float> local_c0;
  ulong local_b8;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_b0;
  uint local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  undefined4 local_84;
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  allocator.memoryResource._4_4_ = in_register_0000008c;
  allocator.memoryResource._0_4_ = nSamples;
  nx = (int)f;
  local_68 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_64 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  local_78 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_74 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  uStack_70 = in_XMM0_Qb;
  uStack_60 = in_XMM1_Qb;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            (&local_b0,(long)nv,(allocator_type *)&local_c0);
  if (0 < nv) {
    uVar10 = 0;
    do {
      if (uVar10 == 0) {
        fVar16 = 0.0;
        auVar15 = ZEXT816(0) << 0x40;
      }
      else {
        lVar11 = 0;
        fVar16 = 1.0;
        uVar8 = uVar10;
        do {
          fVar16 = fVar16 * 0.5;
          lVar11 = (lVar11 - uVar8 / 2) * 2 + uVar8;
          bVar14 = 1 < uVar8;
          uVar8 = uVar8 / 2;
        } while (bVar14);
        auVar15._4_12_ = in_register_000013c4;
        auVar15._0_4_ = in_XMM7_Da;
        auVar15 = vcvtusi2ss_avx512f(auVar15,lVar11);
        lVar11 = 0;
        fVar20 = 1.0;
        uVar8 = uVar10;
        do {
          fVar20 = fVar20 * 0.33333334;
          lVar11 = (lVar11 - uVar8 / 3) * 3 + uVar8;
          bVar14 = 2 < uVar8;
          uVar8 = uVar8 / 3;
        } while (bVar14);
        auVar2._4_12_ = in_register_000013c4;
        auVar2._0_4_ = in_XMM7_Da;
        auVar2 = vcvtusi2ss_avx512f(auVar2,lVar11);
        auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar16 * auVar15._0_4_)))
        ;
        fVar16 = auVar15._0_4_;
        auVar15 = ZEXT416((uint)(fVar20 * auVar2._0_4_));
      }
      auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar15);
      local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar10].super_Tuple2<pbrt::Point2,_float>.x = fVar16;
      local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar10].super_Tuple2<pbrt::Point2,_float>.y =
           auVar15._0_4_;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)nv);
  }
  local_c0.x = 0.0;
  local_c0.y = 1.0;
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  local_c0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  local_c0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_b0,
             (Point2<float> *)&local_c0);
  Array2D<float>::Array2D(__return_storage_ptr__,nx,nu,allocator);
  if (0 < nu) {
    local_90 = (float)nx;
    auVar4._4_4_ = fStack_74;
    auVar4._0_4_ = local_78;
    auVar4._8_8_ = uStack_70;
    local_48 = vmovshdup_avx(auVar4);
    auVar5._4_4_ = fStack_64;
    auVar5._0_4_ = local_68;
    auVar5._8_8_ = uStack_60;
    local_58 = vmovshdup_avx(auVar5);
    local_b8 = 0;
    local_94 = (float)nu;
    local_98 = nu;
    do {
      if (0 < nx) {
        local_8c = (float)(int)local_b8;
        pPVar7 = local_b0.
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar9 = local_b0.
                 super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        iVar12 = 0;
        do {
          if (pPVar9 == pPVar7) {
            fVar16 = 0.0;
            pPVar9 = pPVar7;
          }
          else {
            local_88 = (float)iVar12;
            uVar10 = 0;
            auVar15 = ZEXT816(0);
            do {
              local_80 = auVar15._0_8_;
              fVar16 = (local_88 + pPVar7[uVar10].super_Tuple2<pbrt::Point2,_float>.x) / local_90;
              fVar20 = (local_8c + pPVar7[uVar10].super_Tuple2<pbrt::Point2,_float>.y) / local_94;
              auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * local_68)),
                                        ZEXT416((uint)(1.0 - fVar16)),ZEXT416((uint)local_78));
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * (float)local_58._0_4_)),
                                       ZEXT416((uint)(1.0 - fVar20)),ZEXT416((uint)local_48._0_4_));
              local_c0.x = auVar15._0_4_;
              local_84 = auVar2._0_4_;
              if (*(long *)(this + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              auVar19._0_8_ = (**(code **)(this + 0x18))(this,&local_c0,&local_84);
              auVar19._8_56_ = extraout_var;
              auVar3._8_4_ = 0x7fffffff;
              auVar3._0_8_ = 0x7fffffff7fffffff;
              auVar3._12_4_ = 0x7fffffff;
              auVar15 = vandps_avx512vl(auVar19._0_16_,auVar3);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_80;
              uVar10 = uVar10 + 1;
              auVar18._0_8_ = (double)auVar15._0_4_;
              auVar18._8_8_ = auVar15._8_8_;
              auVar15 = vmaxsd_avx(auVar18,auVar21);
              pPVar7 = local_b0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar10 < (ulong)((long)local_b0.
                                            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_b0.
                                            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
            fVar16 = (float)auVar15._0_8_;
            pPVar9 = local_b0.
                     super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          iVar1 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
          iVar13 = iVar12 + 1;
          __return_storage_ptr__->values
          [((__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1) *
           ((int)local_b8 - (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y)
           + (iVar12 - iVar1)] = fVar16;
          iVar12 = iVar13;
        } while (iVar13 != nx);
      }
      uVar6 = (int)local_b8 + 1;
      local_b8 = (ulong)uVar6;
    } while (uVar6 != local_98);
  }
  if (local_b0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}